

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HopcroftKarpAlgorithm.cpp
# Opt level: O0

void __thiscall
BoxNesting::HopcroftKarpAlgorithm::HopcroftKarpAlgorithm
          (HopcroftKarpAlgorithm *this,
          vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_> *boxes)

{
  bool bVar1;
  size_type sVar2;
  vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_> *in_RSI;
  vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
  *in_RDI;
  int16_t j;
  int16_t i;
  Box *b;
  Box *this_00;
  pointer *this_01;
  vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
  *__n;
  short in_stack_ffffffffffffffe0;
  short sVar3;
  undefined4 in_stack_ffffffffffffffe4;
  
  __n = in_RDI;
  std::
  vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
  ::vector((vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
            *)0x136fc5);
  b = (Box *)&__n[1].
              super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)0x136fd8);
  this_00 = (Box *)&__n[2].
                    super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)0x136feb);
  this_01 = &__n[3].
             super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)0x136ffe);
  sVar2 = std::vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>::size(in_RSI);
  *(short *)&__n[1].
             super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start = (short)sVar2;
  *(undefined2 *)
   ((long)&__n[1].
           super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 2) =
       *(undefined2 *)
        &__n[1].
         super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  std::
  vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
  ::resize((vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
            *)this_01,(size_type)this_00);
  for (sVar3 = 1;
      sVar3 <= *(short *)&in_RDI[1].
                          super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start; sVar3 = sVar3 + 1) {
    std::
    vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
    ::operator[](in_RDI,(long)sVar3);
    std::vector<short,_std::allocator<short>_>::reserve
              ((vector<short,_std::allocator<short>_> *)
               CONCAT44(in_stack_ffffffffffffffe4,CONCAT22(sVar3,in_stack_ffffffffffffffe0)),
               (size_type)__n);
    for (in_stack_ffffffffffffffe0 = 1;
        in_stack_ffffffffffffffe0 <=
        *(short *)((long)&in_RDI[1].
                          super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 2);
        in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffe0 + 1) {
      std::vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>::operator[]
                (in_RSI,(long)(sVar3 + -1));
      std::vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>::operator[]
                (in_RSI,(long)(in_stack_ffffffffffffffe0 + -1));
      bVar1 = Box::operator<(this_00,b);
      if (bVar1) {
        std::
        vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
        ::operator[](in_RDI,(long)sVar3);
        std::vector<short,std::allocator<short>>::emplace_back<short&>
                  ((vector<short,_std::allocator<short>_> *)b,(short *)in_RDI);
      }
    }
    std::
    vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
    ::operator[](in_RDI,(long)sVar3);
    std::vector<short,_std::allocator<short>_>::shrink_to_fit
              ((vector<short,_std::allocator<short>_> *)0x137159);
  }
  return;
}

Assistant:

HopcroftKarpAlgorithm::HopcroftKarpAlgorithm(const std::vector<Box>& boxes)
{
	// In the boxes case the left and right vertices are the same amount since
	// they are the amount of boxes. Since it never exceeds 5000 we can easily
	// cast here
	this->leftVerticesCount = static_cast<int16_t>(boxes.size());
	this->rightVerticesCount = this->leftVerticesCount;

	this->graph.resize(this->leftVerticesCount + 1);

	// This algorithm actually only requires the adjacency list
	// of the left part of the graph so we only construct
	// that. This is because in our boxes case the partitions
	// contain the same amount of vertices.
	for (int16_t i = 1; i <= this->leftVerticesCount; ++i) {
		this->graph[i].reserve(this->rightVerticesCount + 1);
		for (int16_t j = 1; j <= this->rightVerticesCount; ++j) {
			if (boxes[i - 1] < boxes[j - 1]) {
				this->graph[i].emplace_back(j);
			}
		}
		this->graph[i].shrink_to_fit();
	}
}